

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall Rml::DataParser::Parse(DataParser *this,bool is_assignment_expression)

{
  char cVar1;
  ulong uVar2;
  String local_68;
  String local_38;
  byte local_11;
  DataParser *pDStack_10;
  bool is_assignment_expression_local;
  DataParser *this_local;
  
  local_11 = is_assignment_expression;
  pDStack_10 = this;
  ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::clear(&this->program);
  ::std::
  vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
  ::clear(&this->variable_addresses);
  this->index = 0;
  this->reached_end = false;
  this->parse_error = false;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    this->reached_end = true;
  }
  SkipWhitespace(this);
  if ((local_11 & 1) == 0) {
    Rml::Parse::Expression(this);
  }
  else {
    Rml::Parse::Assignment(this);
  }
  if ((this->reached_end & 1U) == 0) {
    this->parse_error = true;
    cVar1 = Look(this);
    CreateString_abi_cxx11_
              (&local_38,"Unexpected character \'%c\' encountered.",(ulong)(uint)(int)cVar1);
    Error(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  if (((this->parse_error & 1U) == 0) && (this->program_stack_size != 0)) {
    this->parse_error = true;
    CreateString_abi_cxx11_
              (&local_68,
               "Internal parser error, inconsistent stack operations. Stack size is %d at parse end."
               ,(ulong)(uint)this->program_stack_size);
    Error(this,&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  return (bool)((this->parse_error ^ 0xffU) & 1);
}

Assistant:

bool Parse(bool is_assignment_expression)
	{
		program.clear();
		variable_addresses.clear();
		index = 0;
		reached_end = false;
		parse_error = false;
		if (expression.empty())
			reached_end = true;

		SkipWhitespace();

		if (is_assignment_expression)
			Parse::Assignment(*this);
		else
			Parse::Expression(*this);

		if (!reached_end)
		{
			parse_error = true;
			Error(CreateString("Unexpected character '%c' encountered.", Look()));
		}
		if (!parse_error && program_stack_size != 0)
		{
			parse_error = true;
			Error(CreateString("Internal parser error, inconsistent stack operations. Stack size is %d at parse end.", program_stack_size));
		}

		return !parse_error;
	}